

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

string * __thiscall
cxxopts::values::abstract_value<std::vector<float,std::allocator<float>>>::
get_implicit_value_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)((long)this + 0x58));
  return __return_storage_ptr__;
}

Assistant:

std::string
      get_implicit_value() const override
      {
        return m_implicit_value;
      }